

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O0

FPError * __thiscall phyr::FPError::operator*(FPError *this,FPError *fp)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double *in_RDX;
  double *in_RSI;
  FPError *in_RDI;
  double _lb;
  double _ub;
  double _b [4];
  undefined8 in_stack_ffffffffffffffa0;
  FPError *this_00;
  double local_38;
  double local_30;
  double local_28;
  double local_20 [4];
  
  local_38 = in_RSI[1] * in_RDX[1];
  local_30 = in_RSI[1] * in_RDX[2];
  local_28 = in_RSI[2] * in_RDX[1];
  local_20[0] = in_RSI[2] * in_RDX[2];
  dVar1 = *in_RSI;
  dVar2 = *in_RDX;
  this_00 = in_RDI;
  pdVar3 = std::min<double>(&local_38,&local_30);
  pdVar4 = std::min<double>(&local_28,local_20);
  std::min<double>(pdVar3,pdVar4);
  _lb = nextFloatDown((double)this_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  pdVar3 = std::max<double>(&local_38,&local_30);
  pdVar4 = std::max<double>(&local_28,local_20);
  std::max<double>(pdVar3,pdVar4);
  _ub = nextFloatUp((double)this_00,(int)((ulong)pdVar3 >> 0x20));
  FPError(this_00,dVar1 * dVar2,_lb,_ub);
  return in_RDI;
}

Assistant:

FPError operator*(const FPError& fp) const {
        Real _b[4] = {
            lBound * fp.lBound, lBound * fp.uBound,
            uBound * fp.lBound, uBound * fp.uBound
        };

        return FPError(v * fp.v,
                       nextFloatDown(std::min(std::min(_b[0], _b[1]), std::min(_b[2], _b[3]))),
                       nextFloatUp(std::max(std::max(_b[0], _b[1]), std::max(_b[2], _b[3]))));
    }